

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

Formats * __thiscall
deqp::gls::FboUtil::FormatDB::getFormats
          (Formats *__return_storage_ptr__,FormatDB *this,FormatFlags requirements)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  FormatFlags requirements_local;
  FormatDB *this_local;
  Formats *ret;
  
  it._M_node._3_1_ = 0;
  it._M_node._4_4_ = requirements;
  std::
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::set(__return_storage_ptr__);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>_>
       ::begin(&this->m_formatFlags);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>_>
         ::end(&this->m_formatFlags);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>
             ::operator->(&local_28);
    if ((ppVar2->second & it._M_node._4_4_) == it._M_node._4_4_) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>
               ::operator->(&local_28);
      std::
      set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::insert(__return_storage_ptr__,&ppVar2->first);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::FormatFlags>_>
    ::operator++(&local_28,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Formats FormatDB::getFormats (FormatFlags requirements) const
{
	Formats ret;
	for (FormatMap::const_iterator it = m_formatFlags.begin(); it != m_formatFlags.end(); it++)
	{
		if ((it->second & requirements) == requirements)
			ret.insert(it->first);
	}
	return ret;
}